

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O2

Array3<BasicStringView<char>_> * __thiscall
Corrade::Containers::BasicStringView<char>::partition
          (Array3<BasicStringView<char>_> *__return_storage_ptr__,BasicStringView<char> *this,
          StringView separator)

{
  char *end;
  ulong size;
  ulong substringSize;
  BasicStringView<char> BVar1;
  BasicStringView<char> BVar2;
  BasicStringView<char> BVar3;
  
  substringSize = separator._sizePlusFlags & 0x3fffffffffffffff;
  BVar1 = *this;
  size = this->_sizePlusFlags & 0x3fffffffffffffff;
  end = Implementation::stringFindString(this->_data,size,separator._data,substringSize);
  if (end == (char *)0x0) {
    BVar2 = exceptPrefix(this,size);
    BVar3 = exceptPrefix(this,size);
  }
  else {
    BVar1 = prefix<char_*,_0>(this,end);
    BVar2 = slice(this,end,end + substringSize);
    BVar3 = suffix(this,end + substringSize);
  }
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[0] =
       BVar1;
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[1] =
       BVar2;
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[2] =
       BVar3;
  return __return_storage_ptr__;
}

Assistant:

Array3<BasicStringView<T>> BasicStringView<T>::partition(const StringView separator) const {
    /** @todo use findOr(StringView) for this, this has an awful lot of
        branches */

    const char* const separatorData = separator.data();
    const std::size_t separatorSize = separator.size();
    const std::size_t size = this->size();
    T* const pos = const_cast<T*>(Implementation::stringFindString(_data, size, separatorData, separatorSize));
    return {
        pos ? prefix(pos) : *this,
        pos ? slice(pos, pos + separatorSize) : exceptPrefix(size),
        pos ? suffix(pos + separatorSize) : exceptPrefix(size)
    };
}